

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShapeAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::ShapeAtomTypesSectionParser::parseShapeFile
          (ShapeAtomTypesSectionParser *this,ForceField *param_2,string *shapeFileName,AtomType *at)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  void *pvVar6;
  double *pdVar7;
  ifstrstream *piVar8;
  SimpleTypeData<OpenMD::ShapeAtomType_*> *this_00;
  AtomType *in_RCX;
  string *in_RDX;
  RealType RVar9;
  StringTokenizer tokenInfo3;
  StringTokenizer tokenInfo2;
  StringTokenizer tokenInfo1;
  Mat3x3d I;
  DirectionalAdapter da;
  StringTokenizer tokenInfo;
  ShapeAtomType *st;
  char *tempPath;
  string ffPath;
  string tempString;
  ifstrstream shapeStream;
  vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  functionVector;
  RealSphericalHarmonic *rsh;
  Mat3x3d momInert;
  string token;
  char buffer [65535];
  int bufferSize;
  SimpleTypeData<OpenMD::ShapeAtomType_*> *in_stack_fffffffffffef618;
  StringTokenizer *in_stack_fffffffffffef620;
  value_type *in_stack_fffffffffffef628;
  StringTokenizer *in_stack_fffffffffffef630;
  locale *in_stack_fffffffffffef638;
  ifstrstream *in_stack_fffffffffffef640;
  undefined7 in_stack_fffffffffffef650;
  undefined1 in_stack_fffffffffffef657;
  string *in_stack_fffffffffffef658;
  StringTokenizer *in_stack_fffffffffffef660;
  locale *in_stack_fffffffffffef668;
  ifstrstream *in_stack_fffffffffffef670;
  errorStruct *in_stack_fffffffffffef698;
  int in_stack_fffffffffffef6a0;
  int in_stack_fffffffffffef6a4;
  undefined4 in_stack_fffffffffffef6b8;
  undefined4 in_stack_fffffffffffef6bc;
  DirectionalAdapter *in_stack_fffffffffffef6c0;
  ifstrstream *in_stack_fffffffffffef6c8;
  allocator<char> aStack_107b1;
  string asStack_107b0 [72];
  locale alStack_10768 [8];
  string sStack_10760;
  allocator<char> aStack_10739;
  string asStack_10738 [39];
  allocator<char> aStack_10711;
  string asStack_10710 [144];
  locale alStack_10680 [8];
  string asStack_10678 [39];
  allocator<char> aStack_10651;
  string asStack_10650 [39];
  allocator<char> aStack_10629;
  string asStack_10628 [88];
  char *in_stack_fffffffffffefa30;
  istream *in_stack_fffffffffffefa38;
  locale alStack_10598 [8];
  string asStack_10590 [39];
  allocator<char> aStack_10569;
  string asStack_10568 [39];
  allocator<char> aStack_10541;
  string asStack_10540 [192];
  RectMatrix<double,_3U,_3U> RStack_10480;
  DirectionalAdapter DStack_10438;
  allocator<char> aStack_10429;
  string asStack_10428 [39];
  allocator<char> aStack_10401;
  string asStack_10400 [120];
  void *pvStack_10388;
  char *pcStack_10380;
  string asStack_10378 [32];
  string asStack_10358 [32];
  ifstrstream iStack_10338;
  ifstrstream *piStack_100a8;
  StringTokenizer aSStack_10048 [745];
  
  std::__cxx11::string::string((string *)aSStack_10048);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x2a26bc);
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  vector((vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
          *)0x2a26cb);
  ifstrstream::ifstrstream(in_stack_fffffffffffef640);
  std::__cxx11::string::string(asStack_10358);
  std::__cxx11::string::string(asStack_10378);
  pcStack_10380 = getenv("FORCE_PARAM_PATH");
  if (pcStack_10380 == (char *)0x0) {
    std::__cxx11::string::operator=(asStack_10378,"/usr/local/openmd/forceFields");
  }
  else {
    std::__cxx11::string::operator=(asStack_10378,pcStack_10380);
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  ifstrstream::open(&iStack_10338,pcVar4,8,0);
  bVar1 = ifstrstream::is_open((ifstrstream *)0x2a27c2);
  if (!bVar1) {
    std::__cxx11::string::operator=(asStack_10358,asStack_10378);
    std::__cxx11::string::operator+=(asStack_10358,"/");
    std::__cxx11::string::operator+=(asStack_10358,in_RDX);
    std::__cxx11::string::operator=(in_RDX,asStack_10358);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    ifstrstream::open(&iStack_10338,pcVar4,8,0);
    bVar1 = ifstrstream::is_open((ifstrstream *)0x2a286a);
    if (!bVar1) {
      uVar5 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,
               "Error opening the shape file:\n\t%s\n\tHave you tried setting the FORCE_PARAM_PATH environment variable?\n"
               ,uVar5);
      painCave.severity = 1;
      painCave.isFatal = 1;
      simError();
    }
  }
  pvVar6 = operator_new(0x48);
  ShapeAtomType::ShapeAtomType((ShapeAtomType *)in_stack_fffffffffffef620);
  pvStack_10388 = pvVar6;
  findBegin(in_stack_fffffffffffefa38,in_stack_fffffffffffefa30);
  std::istream::getline((char *)&iStack_10338,(long)&aSStack_10048[0].delim_);
  while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
    if ((aSStack_10048[0].delim_._M_dataplus != (_Alloc_hider)0x21) &&
       (aSStack_10048[0].delim_._M_dataplus != (_Alloc_hider)0x23)) {
      iVar3 = isEndLine((char *)in_stack_fffffffffffef628);
      if (iVar3 != 0) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffef660->tokenString_,(char *)in_stack_fffffffffffef658,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffef657,in_stack_fffffffffffef650));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffef660->tokenString_,(char *)in_stack_fffffffffffef658,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffef657,in_stack_fffffffffffef650));
      StringTokenizer::StringTokenizer
                (in_stack_fffffffffffef660,in_stack_fffffffffffef658,
                 (string *)CONCAT17(in_stack_fffffffffffef657,in_stack_fffffffffffef650));
      std::__cxx11::string::~string(asStack_10428);
      std::allocator<char>::~allocator(&aStack_10429);
      std::__cxx11::string::~string(asStack_10400);
      std::allocator<char>::~allocator(&aStack_10401);
      iVar3 = StringTokenizer::countTokens(in_stack_fffffffffffef630);
      if (iVar3 != 0) {
        iVar3 = StringTokenizer::countTokens(in_stack_fffffffffffef630);
        if (iVar3 < 5) {
          uVar5 = std::__cxx11::string::c_str();
          snprintf(painCave.errMsg,2000,
                   "ShapesAtomTypesSectionParser Error: Not enough information on a ShapeInfo line in file: %s\n"
                   ,uVar5);
          painCave.severity = 1;
          painCave.isFatal = 1;
          simError();
        }
        else {
          StringTokenizer::skipToken(in_stack_fffffffffffef630);
          StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffef660);
          AtomType::setMass((AtomType *)in_stack_fffffffffffef670,
                            (RealType)in_stack_fffffffffffef668);
          DirectionalAdapter::DirectionalAdapter(&DStack_10438,in_RCX);
          SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x2a2c4d);
          RVar9 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffef660);
          pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&RStack_10480,0,0);
          *pdVar7 = RVar9;
          RVar9 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffef660);
          pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&RStack_10480,1,1);
          *pdVar7 = RVar9;
          RVar9 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffef660);
          pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&RStack_10480,2,2);
          *pdVar7 = RVar9;
          SquareMatrix3<double>::SquareMatrix3
                    ((SquareMatrix3<double> *)in_stack_fffffffffffef620,
                     (SquareMatrix3<double> *)in_stack_fffffffffffef618);
          DirectionalAdapter::makeDirectional
                    (in_stack_fffffffffffef6c0,
                     (Mat3x3d *)CONCAT44(in_stack_fffffffffffef6bc,in_stack_fffffffffffef6b8));
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2a2d68);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2a2d75);
        }
      }
      StringTokenizer::~StringTokenizer(in_stack_fffffffffffef620);
    }
    std::istream::getline((char *)&iStack_10338,(long)&aSStack_10048[0].delim_);
  }
  findBegin(in_stack_fffffffffffefa38,in_stack_fffffffffffefa30);
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  clear((vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_> *
        )0x2a2e24);
  std::istream::getline((char *)&iStack_10338,(long)&aSStack_10048[0].delim_);
  while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
    if ((aSStack_10048[0].delim_._M_dataplus != (_Alloc_hider)0x21) &&
       (aSStack_10048[0].delim_._M_dataplus != (_Alloc_hider)0x23)) {
      iVar3 = isEndLine((char *)in_stack_fffffffffffef628);
      if (iVar3 != 0) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffef660->tokenString_,(char *)in_stack_fffffffffffef658,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffef657,in_stack_fffffffffffef650));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffef660->tokenString_,(char *)in_stack_fffffffffffef658,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffef657,in_stack_fffffffffffef650));
      StringTokenizer::StringTokenizer
                (in_stack_fffffffffffef660,in_stack_fffffffffffef658,
                 (string *)CONCAT17(in_stack_fffffffffffef657,in_stack_fffffffffffef650));
      std::__cxx11::string::~string(asStack_10568);
      std::allocator<char>::~allocator(&aStack_10569);
      std::__cxx11::string::~string(asStack_10540);
      std::allocator<char>::~allocator(&aStack_10541);
      iVar3 = StringTokenizer::countTokens(in_stack_fffffffffffef630);
      if (iVar3 != 0) {
        iVar3 = StringTokenizer::countTokens(in_stack_fffffffffffef630);
        if (iVar3 < 4) {
          uVar5 = std::__cxx11::string::c_str();
          snprintf(painCave.errMsg,2000,
                   "ShapesAtomTypesSectionParser Error: Not enough information on a ContactFunctions line in file: %s\n"
                   ,uVar5);
          painCave.severity = 1;
          painCave.isFatal = 1;
          simError();
        }
        else {
          piVar8 = (ifstrstream *)operator_new(0x20);
          RealSphericalHarmonic::RealSphericalHarmonic((RealSphericalHarmonic *)piVar8);
          piStack_100a8 = piVar8;
          iVar3 = StringTokenizer::nextTokenAsInt((StringTokenizer *)in_stack_fffffffffffef640);
          RealSphericalHarmonic::setL((RealSphericalHarmonic *)piVar8,iVar3);
          piVar8 = piStack_100a8;
          iVar3 = StringTokenizer::nextTokenAsInt((StringTokenizer *)in_stack_fffffffffffef640);
          RealSphericalHarmonic::setM((RealSphericalHarmonic *)piVar8,iVar3);
          StringTokenizer::nextToken_abi_cxx11_((StringTokenizer *)in_stack_fffffffffffef6c8);
          std::__cxx11::string::operator=((string *)aSStack_10048,asStack_10590);
          std::__cxx11::string::~string(asStack_10590);
          std::locale::locale(alStack_10598);
          toLower<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffef640,in_stack_fffffffffffef638);
          std::locale::~locale(alStack_10598);
          bVar1 = std::operator==(&in_stack_fffffffffffef620->tokenString_,
                                  (char *)in_stack_fffffffffffef618);
          if (bVar1) {
            RealSphericalHarmonic::makeSinFunction((RealSphericalHarmonic *)piStack_100a8);
          }
          else {
            RealSphericalHarmonic::makeCosFunction((RealSphericalHarmonic *)piStack_100a8);
          }
          piVar8 = piStack_100a8;
          RVar9 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffef660);
          RealSphericalHarmonic::setCoefficient((RealSphericalHarmonic *)piVar8,RVar9);
          std::
          vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
          ::push_back((vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                       *)in_stack_fffffffffffef630,in_stack_fffffffffffef628);
        }
      }
      StringTokenizer::~StringTokenizer(in_stack_fffffffffffef620);
    }
    std::istream::getline((char *)&iStack_10338,(long)&aSStack_10048[0].delim_);
  }
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  vector((vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
          *)in_stack_fffffffffffef670,
         (vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
          *)in_stack_fffffffffffef668);
  ShapeAtomType::setContactFuncs
            ((ShapeAtomType *)in_stack_fffffffffffef620,
             (vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
              *)in_stack_fffffffffffef618);
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  ~vector((vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
           *)in_stack_fffffffffffef630);
  findBegin(in_stack_fffffffffffefa38,in_stack_fffffffffffefa30);
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  clear((vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_> *
        )0x2a3383);
  std::istream::getline((char *)&iStack_10338,(long)&aSStack_10048[0].delim_);
  while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
    if ((aSStack_10048[0].delim_._M_dataplus != (_Alloc_hider)0x21) &&
       (aSStack_10048[0].delim_._M_dataplus != (_Alloc_hider)0x23)) {
      iVar3 = isEndLine((char *)in_stack_fffffffffffef628);
      if (iVar3 != 0) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffef660->tokenString_,(char *)in_stack_fffffffffffef658,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffef657,in_stack_fffffffffffef650));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffef660->tokenString_,(char *)in_stack_fffffffffffef658,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffef657,in_stack_fffffffffffef650));
      StringTokenizer::StringTokenizer
                (in_stack_fffffffffffef660,in_stack_fffffffffffef658,
                 (string *)CONCAT17(in_stack_fffffffffffef657,in_stack_fffffffffffef650));
      std::__cxx11::string::~string(asStack_10650);
      std::allocator<char>::~allocator(&aStack_10651);
      std::__cxx11::string::~string(asStack_10628);
      std::allocator<char>::~allocator(&aStack_10629);
      iVar3 = StringTokenizer::countTokens(in_stack_fffffffffffef630);
      if (iVar3 != 0) {
        iVar3 = StringTokenizer::countTokens(in_stack_fffffffffffef630);
        if (iVar3 < 4) {
          uVar5 = std::__cxx11::string::c_str();
          snprintf(painCave.errMsg,2000,
                   "ShapesAtomTypesSectionParser Error: Not enough information on a RangeFunctions line in file: %s\n"
                   ,uVar5);
          painCave.severity = 1;
          painCave.isFatal = 1;
          simError();
        }
        else {
          piVar8 = (ifstrstream *)operator_new(0x20);
          RealSphericalHarmonic::RealSphericalHarmonic((RealSphericalHarmonic *)piVar8);
          piStack_100a8 = piVar8;
          iVar3 = StringTokenizer::nextTokenAsInt((StringTokenizer *)in_stack_fffffffffffef640);
          RealSphericalHarmonic::setL((RealSphericalHarmonic *)piVar8,iVar3);
          piVar8 = piStack_100a8;
          iVar3 = StringTokenizer::nextTokenAsInt((StringTokenizer *)in_stack_fffffffffffef640);
          RealSphericalHarmonic::setM((RealSphericalHarmonic *)piVar8,iVar3);
          StringTokenizer::nextToken_abi_cxx11_((StringTokenizer *)in_stack_fffffffffffef6c8);
          std::__cxx11::string::operator=((string *)aSStack_10048,asStack_10678);
          std::__cxx11::string::~string(asStack_10678);
          std::locale::locale(alStack_10680);
          toLower<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffef640,in_stack_fffffffffffef638);
          std::locale::~locale(alStack_10680);
          bVar1 = std::operator==(&in_stack_fffffffffffef620->tokenString_,
                                  (char *)in_stack_fffffffffffef618);
          if (bVar1) {
            RealSphericalHarmonic::makeSinFunction((RealSphericalHarmonic *)piStack_100a8);
          }
          else {
            RealSphericalHarmonic::makeCosFunction((RealSphericalHarmonic *)piStack_100a8);
          }
          in_stack_fffffffffffef6c8 = piStack_100a8;
          RVar9 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffef660);
          RealSphericalHarmonic::setCoefficient
                    ((RealSphericalHarmonic *)in_stack_fffffffffffef6c8,RVar9);
          std::
          vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
          ::push_back((vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                       *)in_stack_fffffffffffef630,in_stack_fffffffffffef628);
        }
      }
      StringTokenizer::~StringTokenizer(in_stack_fffffffffffef620);
    }
    std::istream::getline((char *)&iStack_10338,(long)&aSStack_10048[0].delim_);
  }
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  vector((vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
          *)in_stack_fffffffffffef670,
         (vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
          *)in_stack_fffffffffffef668);
  ShapeAtomType::setRangeFuncs
            ((ShapeAtomType *)in_stack_fffffffffffef620,
             (vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
              *)in_stack_fffffffffffef618);
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  ~vector((vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
           *)in_stack_fffffffffffef630);
  findBegin(in_stack_fffffffffffefa38,in_stack_fffffffffffefa30);
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  clear((vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_> *
        )0x2a3908);
  std::istream::getline((char *)&iStack_10338,(long)&aSStack_10048[0].delim_);
  while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
    if ((aSStack_10048[0].delim_._M_dataplus != (_Alloc_hider)0x21) &&
       (aSStack_10048[0].delim_._M_dataplus != (_Alloc_hider)0x23)) {
      iVar3 = isEndLine((char *)in_stack_fffffffffffef628);
      if (iVar3 != 0) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffef660->tokenString_,(char *)in_stack_fffffffffffef658,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffef657,in_stack_fffffffffffef650));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffef660->tokenString_,(char *)in_stack_fffffffffffef658,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffef657,in_stack_fffffffffffef650));
      StringTokenizer::StringTokenizer
                (in_stack_fffffffffffef660,in_stack_fffffffffffef658,
                 (string *)CONCAT17(in_stack_fffffffffffef657,in_stack_fffffffffffef650));
      std::__cxx11::string::~string(asStack_10738);
      std::allocator<char>::~allocator(&aStack_10739);
      std::__cxx11::string::~string(asStack_10710);
      std::allocator<char>::~allocator(&aStack_10711);
      in_stack_fffffffffffef6a4 = StringTokenizer::countTokens(in_stack_fffffffffffef630);
      if (in_stack_fffffffffffef6a4 != 0) {
        in_stack_fffffffffffef6a0 = StringTokenizer::countTokens(in_stack_fffffffffffef630);
        if (in_stack_fffffffffffef6a0 < 4) {
          uVar5 = std::__cxx11::string::c_str();
          in_stack_fffffffffffef698 = &painCave;
          snprintf(painCave.errMsg,2000,
                   "ShapesAtomTypesSectionParser Error: Not enough information on a StrengthFunctions line in file: %s\n"
                   ,uVar5);
          in_stack_fffffffffffef698->severity = 1;
          in_stack_fffffffffffef698->isFatal = 1;
          simError();
        }
        else {
          piVar8 = (ifstrstream *)operator_new(0x20);
          RealSphericalHarmonic::RealSphericalHarmonic((RealSphericalHarmonic *)piVar8);
          piStack_100a8 = piVar8;
          iVar3 = StringTokenizer::nextTokenAsInt((StringTokenizer *)in_stack_fffffffffffef640);
          RealSphericalHarmonic::setL((RealSphericalHarmonic *)piVar8,iVar3);
          in_stack_fffffffffffef670 = piStack_100a8;
          iVar3 = StringTokenizer::nextTokenAsInt((StringTokenizer *)in_stack_fffffffffffef640);
          RealSphericalHarmonic::setM((RealSphericalHarmonic *)in_stack_fffffffffffef670,iVar3);
          StringTokenizer::nextToken_abi_cxx11_((StringTokenizer *)in_stack_fffffffffffef6c8);
          in_stack_fffffffffffef660 = aSStack_10048;
          in_stack_fffffffffffef658 = &sStack_10760;
          std::__cxx11::string::operator=
                    ((string *)in_stack_fffffffffffef660,(string *)in_stack_fffffffffffef658);
          std::__cxx11::string::~string((string *)in_stack_fffffffffffef658);
          in_stack_fffffffffffef668 = alStack_10768;
          std::locale::locale(in_stack_fffffffffffef668);
          toLower<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffef640,in_stack_fffffffffffef638);
          std::locale::~locale(alStack_10768);
          in_stack_fffffffffffef657 =
               std::operator==(&in_stack_fffffffffffef620->tokenString_,
                               (char *)in_stack_fffffffffffef618);
          if ((bool)in_stack_fffffffffffef657) {
            RealSphericalHarmonic::makeSinFunction((RealSphericalHarmonic *)piStack_100a8);
          }
          else {
            RealSphericalHarmonic::makeCosFunction((RealSphericalHarmonic *)piStack_100a8);
          }
          in_stack_fffffffffffef640 = piStack_100a8;
          RVar9 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffef660);
          RealSphericalHarmonic::setCoefficient
                    ((RealSphericalHarmonic *)in_stack_fffffffffffef640,RVar9);
          std::
          vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
          ::push_back((vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                       *)in_stack_fffffffffffef630,in_stack_fffffffffffef628);
        }
      }
      StringTokenizer::~StringTokenizer(in_stack_fffffffffffef620);
    }
    std::istream::getline((char *)&iStack_10338,(long)&aSStack_10048[0].delim_);
  }
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  vector((vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
          *)in_stack_fffffffffffef670,
         (vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
          *)in_stack_fffffffffffef668);
  ShapeAtomType::setStrengthFuncs
            ((ShapeAtomType *)in_stack_fffffffffffef620,
             (vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
              *)in_stack_fffffffffffef618);
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  ~vector((vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
           *)in_stack_fffffffffffef630);
  this_00 = (SimpleTypeData<OpenMD::ShapeAtomType_*> *)operator_new(0x30);
  piVar8 = (ifstrstream *)&aStack_107b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_fffffffffffef660->tokenString_,(char *)in_stack_fffffffffffef658,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffef657,in_stack_fffffffffffef650));
  SimpleTypeData<OpenMD::ShapeAtomType_*>::SimpleTypeData
            (this_00,(string *)in_RCX,(ShapeAtomType **)piVar8);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::ShapeAtomType*>,void>
            ((shared_ptr<OpenMD::GenericData> *)piVar8,in_stack_fffffffffffef618);
  AtomType::addProperty
            ((AtomType *)CONCAT44(in_stack_fffffffffffef6a4,in_stack_fffffffffffef6a0),
             (shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffef698);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x2a3ec8);
  std::__cxx11::string::~string(asStack_107b0);
  std::allocator<char>::~allocator(&aStack_107b1);
  std::__cxx11::string::~string(asStack_10378);
  std::__cxx11::string::~string(asStack_10358);
  ifstrstream::~ifstrstream(piVar8);
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  ~vector((vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
           *)this_00);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2a3f23);
  std::__cxx11::string::~string((string *)aSStack_10048);
  return;
}

Assistant:

void ShapeAtomTypesSectionParser::parseShapeFile(ForceField&,
                                                   std::string& shapeFileName,
                                                   AtomType* at) {
    const int bufferSize = 65535;
    char buffer[bufferSize];
    std::string token;

    Mat3x3d momInert;
    RealSphericalHarmonic* rsh;
    std::vector<RealSphericalHarmonic*> functionVector;
    ifstrstream shapeStream;
    std::string tempString;
    std::string ffPath;
    char* tempPath;

    tempPath = getenv("FORCE_PARAM_PATH");

    if (tempPath == NULL) {
      // convert a macro from compiler to a string in c++
      STR_DEFINE(ffPath, FRC_PATH);
    } else {
      ffPath = tempPath;
    }

    shapeStream.open(shapeFileName.c_str());

    if (!shapeStream.is_open()) {
      tempString = ffPath;
      tempString += "/";
      tempString += shapeFileName;
      shapeFileName = tempString;

      shapeStream.open(shapeFileName.c_str());

      if (!shapeStream.is_open()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Error opening the shape file:\n"
                 "\t%s\n"
                 "\tHave you tried setting the FORCE_PARAM_PATH environment "
                 "variable?\n",
                 shapeFileName.c_str());
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }
    }

    ShapeAtomType* st = new ShapeAtomType();

    // first parse the info. in the ShapeInfo section
    findBegin(shapeStream, "ShapeInfo");
    shapeStream.getline(buffer, bufferSize);

    // loop over the interior of the ShapeInfo section
    while (!shapeStream.eof()) {
      // toss comment lines
      if (buffer[0] != '!' && buffer[0] != '#') {
        // end marks section completion
        if (isEndLine(buffer)) break;
        StringTokenizer tokenInfo(buffer);
        // blank lines are ignored
        if (tokenInfo.countTokens() != 0) {
          if (tokenInfo.countTokens() < 5) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "ShapesAtomTypesSectionParser Error: Not enough "
                     "information on a ShapeInfo line in file: %s\n",
                     shapeFileName.c_str());
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          } else {
            tokenInfo.skipToken();
            at->setMass(tokenInfo.nextTokenAsDouble());
            DirectionalAdapter da = DirectionalAdapter(at);
            Mat3x3d I;
            I(0, 0) = tokenInfo.nextTokenAsDouble();
            I(1, 1) = tokenInfo.nextTokenAsDouble();
            I(2, 2) = tokenInfo.nextTokenAsDouble();
            da.makeDirectional(I);
          }
        }
      }
      shapeStream.getline(buffer, bufferSize);
    }

    // now grab the contact functions
    findBegin(shapeStream, "ContactFunctions");
    functionVector.clear();

    shapeStream.getline(buffer, bufferSize);
    while (!shapeStream.eof()) {
      // toss comment lines
      if (buffer[0] != '!' && buffer[0] != '#') {
        // end marks section completion
        if (isEndLine(buffer)) break;
        StringTokenizer tokenInfo1(buffer);
        // blank lines are ignored
        if (tokenInfo1.countTokens() != 0) {
          if (tokenInfo1.countTokens() < 4) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "ShapesAtomTypesSectionParser Error: Not enough "
                     "information on a ContactFunctions line in file: %s\n",
                     shapeFileName.c_str());
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          } else {
            // read in a spherical harmonic function
            rsh = new RealSphericalHarmonic();
            rsh->setL(tokenInfo1.nextTokenAsInt());
            rsh->setM(tokenInfo1.nextTokenAsInt());
            token = tokenInfo1.nextToken();
            toLower(token);
            if (token == "sin")
              rsh->makeSinFunction();
            else
              rsh->makeCosFunction();
            rsh->setCoefficient(tokenInfo1.nextTokenAsDouble());

            functionVector.push_back(rsh);
          }
        }
      }
      shapeStream.getline(buffer, bufferSize);
    }

    // pass contact functions to ShapeType
    st->setContactFuncs(functionVector);

    // now grab the range functions
    findBegin(shapeStream, "RangeFunctions");
    functionVector.clear();

    shapeStream.getline(buffer, bufferSize);
    while (!shapeStream.eof()) {
      // toss comment lines
      if (buffer[0] != '!' && buffer[0] != '#') {
        // end marks section completion
        if (isEndLine(buffer)) break;
        StringTokenizer tokenInfo2(buffer);
        // blank lines are ignored
        if (tokenInfo2.countTokens() != 0) {
          if (tokenInfo2.countTokens() < 4) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "ShapesAtomTypesSectionParser Error: Not enough "
                     "information on a RangeFunctions line in file: %s\n",
                     shapeFileName.c_str());
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          } else {
            // read in a spherical harmonic function
            rsh = new RealSphericalHarmonic();
            rsh->setL(tokenInfo2.nextTokenAsInt());
            rsh->setM(tokenInfo2.nextTokenAsInt());
            token = tokenInfo2.nextToken();
            toLower(token);
            if (token == "sin")
              rsh->makeSinFunction();
            else
              rsh->makeCosFunction();
            rsh->setCoefficient(tokenInfo2.nextTokenAsDouble());

            functionVector.push_back(rsh);
          }
        }
      }
      shapeStream.getline(buffer, bufferSize);
    }

    // pass range functions to ShapeType
    st->setRangeFuncs(functionVector);

    // finally grab the strength functions
    findBegin(shapeStream, "StrengthFunctions");
    functionVector.clear();

    shapeStream.getline(buffer, bufferSize);
    while (!shapeStream.eof()) {
      // toss comment lines
      if (buffer[0] != '!' && buffer[0] != '#') {
        // end marks section completion
        if (isEndLine(buffer)) break;
        StringTokenizer tokenInfo3(buffer);
        // blank lines are ignored
        if (tokenInfo3.countTokens() != 0) {
          if (tokenInfo3.countTokens() < 4) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "ShapesAtomTypesSectionParser Error: Not enough "
                     "information on a StrengthFunctions line in file: %s\n",
                     shapeFileName.c_str());
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          } else {
            // read in a spherical harmonic function
            rsh = new RealSphericalHarmonic();
            rsh->setL(tokenInfo3.nextTokenAsInt());
            rsh->setM(tokenInfo3.nextTokenAsInt());
            token = tokenInfo3.nextToken();
            toLower(token);
            if (token == "sin")
              rsh->makeSinFunction();
            else
              rsh->makeCosFunction();
            rsh->setCoefficient(tokenInfo3.nextTokenAsDouble());

            functionVector.push_back(rsh);
          }
        }
      }
      shapeStream.getline(buffer, bufferSize);
    }

    // pass strength functions to ShapeType
    st->setStrengthFuncs(functionVector);
    at->addProperty(
        std::shared_ptr<GenericData>(new ShapeAtypeData("Shape", st)));
    //  delete shapeStream;
  }